

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::CartesianProductGenerator<int,_aom_rc_mode,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *base,
          tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          *generators,bool is_end)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer *__ptr;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  *p_Var2;
  ParamIterator<aom_rc_mode> local_48;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> local_40;
  ParamIterator<int> local_38;
  
  (this->super_ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_010873c8;
  this->base_ = base;
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
             ).super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var,iVar1);
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          ).
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          .super__Head_base<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_false>._M_head_impl
          .impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl._4_4_ = extraout_var_00;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                                  .super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>_>.
                                  super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>
                                  ._M_head_impl.impl_.
                                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                     + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
              *)&this->begin_,(ParamIterator<int> *)&local_40,&local_48,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_48.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
             ).super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var_01,iVar1);
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          ).
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          .super__Head_base<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_false>._M_head_impl
          .impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl._4_4_ = extraout_var_02;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                                  .super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>_>.
                                  super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>
                                  ._M_head_impl.impl_.
                                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                     + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>,testing::internal::ParamIterator<int>>
              *)&this->end_,(ParamIterator<int> *)&local_40,&local_48,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_48.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  p_Var2 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  ;
  if (is_end) {
    p_Var2 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
                ,p_Var2);
  (this->current_value_).
  super___shared_ptr<std::tuple<int,_aom_rc_mode,_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<int,_aom_rc_mode,_int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }